

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void block_expr(Vm *vm)

{
  _Bool _Var1;
  OP_CODE OVar2;
  byte local_11;
  Vm *vm_local;
  
  primary(vm);
  if ((vm->compiler).previous.type != TOKEN_CLOSE_BRACE) {
    open_scope(vm);
    while( true ) {
      _Var1 = check(vm,TOKEN_CLOSE_BRACE);
      local_11 = 0;
      if (!_Var1) {
        _Var1 = check(vm,TOKEN_EOF);
        local_11 = _Var1 ^ 0xff;
      }
      if ((local_11 & 1) == 0) break;
      stmt(vm);
    }
    OVar2 = last_instruction(vm);
    if (OVar2 == OP_POP) {
      remove_arg(vm);
    }
    close_scope(vm);
    advance(vm);
  }
  return;
}

Assistant:

static void block_expr(Vm *vm) {
    primary(vm);

    if (vm->compiler.previous.type == TOKEN_CLOSE_BRACE) {
        return;
    }

    open_scope(vm);
    while (!check(vm, TOKEN_CLOSE_BRACE) && !check(vm, TOKEN_EOF)) {
        stmt(vm);
    }

    // block expression needs a return value
    if (last_instruction(vm) == OP_POP) {
        remove_arg(vm);
    }

    close_scope(vm);
    advance(vm);
}